

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_6_is_does_list(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *node;
  PVIPNode *child;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  node = G->val[-2];
  child = PVIP_node_new_children1(&G->data,PVIP_NODE_IS,G->val[-1]);
  PVIP_node_push_child(node,child);
  return;
}

Assistant:

YY_ACTION(void) yy_6_is_does_list(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define b G->val[-1]
#define a G->val[-2]
  yyprintf((stderr, "do yy_6_is_does_list"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {PVIP_node_push_child(a, PVIP_node_new_children1(&(G->data), PVIP_NODE_IS, b)); }\n"));
  PVIP_node_push_child(a, PVIP_node_new_children1(&(G->data), PVIP_NODE_IS, b)); ;
#undef b
#undef a
}